

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

int ConvexDecomposition::maxdirfiltered<ConvexDecomposition::float3>
              (float3 *p,int count,float3 *dir,Array<int> *allow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  float *pfVar5;
  ulong uVar6;
  float fVar7;
  undefined1 auVar8 [64];
  
  if (count == 0) {
    __assert_fail("count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x894,
                  "int ConvexDecomposition::maxdirfiltered(const T *, int, const T &, Array<int> &) [T = ConvexDecomposition::float3]"
                 );
  }
  if (0 < count) {
    if ((uint)(~(allow->count >> 0x1f) & allow->count) <= count - 1U) {
      __assert_fail("i>=0 && i<count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x577,"Type &ConvexDecomposition::Array<int>::operator[](int) [Type = int]");
    }
    pfVar5 = &p->z;
    iVar4 = -1;
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(dir->y * p->y)),ZEXT416((uint)dir->x),
                             ZEXT416((uint)p->x));
    auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)dir->z),ZEXT416((uint)p->z));
    auVar8 = ZEXT1664(auVar1);
    uVar6 = 0;
    do {
      iVar3 = iVar4;
      if ((allow->element[uVar6] != 0) && (iVar3 = (int)uVar6, iVar4 != -1)) {
        auVar1 = vfmadd231ss_fma(ZEXT416((uint)(dir->y * pfVar5[-1])),ZEXT416((uint)dir->x),
                                 ZEXT416((uint)((float3 *)(pfVar5 + -2))->x));
        auVar2 = vfmadd231ss_fma(auVar1,ZEXT416((uint)dir->z),ZEXT416((uint)*pfVar5));
        fVar7 = auVar8._0_4_;
        auVar1 = vmaxss_avx(auVar2,auVar8._0_16_);
        auVar8 = ZEXT1664(auVar1);
        iVar3 = iVar4;
        if (fVar7 < auVar2._0_4_) {
          iVar3 = (int)uVar6;
        }
      }
      iVar4 = iVar3;
      uVar6 = uVar6 + 1;
      pfVar5 = pfVar5 + 3;
    } while ((uint)count != uVar6);
    if (iVar4 != -1) {
      return iVar4;
    }
  }
  __assert_fail("m!=-1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x8aa,
                "int ConvexDecomposition::maxdirfiltered(const T *, int, const T &, Array<int> &) [T = ConvexDecomposition::float3]"
               );
}

Assistant:

int maxdirfiltered(const T *p,int count,const T &dir,Array<int> &allow)
{
	assert(count);
	int m=-1;
	float currDotm = dot(p[0], dir);
	for(int i=0;i<count;i++) 
	{
		if(allow[i])
		{
			if(m==-1 )
			{
				m=i;
			}
			else 
			{
				const float currDoti = dot(p[i], dir);
				if (currDoti>currDotm)
				{
					currDotm = currDoti;
					m=i;
				}
			}
		}
	}
	assert(m!=-1);
	return m;
}